

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Sampling_Linear_Test::TestBody(Sampling_Linear_Test *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  Allocator AVar7;
  int i;
  int iVar8;
  long lVar9;
  char *pcVar10;
  char *in_R9;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  Float FVar14;
  float fVar15;
  float fVar16;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar17 [16];
  undefined4 extraout_XMM0_Dd;
  Float a;
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 in_ZMM4 [64];
  span<const_float> f;
  Float dp;
  undefined4 uStack_1b4;
  Float local_1ac;
  RNG rng;
  undefined1 local_198 [16];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_2;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  Uniform1DIter __begin1;
  string local_100;
  AssertHelper local_e0;
  Uniform1DIter __end1;
  vector<int,_std::allocator<int>_> buckets;
  PiecewiseConstant1D distrib;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  distrib.func.alloc.memoryResource._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&buckets,0x20,(value_type_conflict3 *)&distrib,(allocator_type *)&values);
  for (lVar12 = 0; lVar12 != 0x28; lVar12 = lVar12 + 8) {
    iVar1 = *(int *)((long)&DAT_00586a50 + lVar12);
    iVar2 = *(int *)((long)&DAT_00586a54 + lVar12);
    for (iVar8 = 0; iVar8 != 1000000; iVar8 = iVar8 + 1) {
      FVar14 = pbrt::SampleLinear(((float)iVar8 + 0.5) / 1e+06,(float)iVar1,(float)iVar2);
      iVar6 = (int)(FVar14 * 32.0);
      if (0x1e < iVar6) {
        iVar6 = 0x1f;
      }
      buckets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [iVar6] = buckets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar6] + 1;
    }
    lVar9 = 0;
    for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
      fVar15 = (float)(int)lVar11 / 31.0;
      auVar18._0_4_ =
           (float)*buckets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
      auVar18._4_12_ = in_ZMM4._4_12_;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * (float)buckets.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[0x1f])),
                                auVar18,ZEXT416((uint)(1.0 - fVar15)));
      auVar17._0_4_ = (int)auVar13._0_4_;
      auVar17._4_4_ = (int)auVar13._4_4_;
      auVar17._8_4_ = (int)auVar13._8_4_;
      auVar17._12_4_ = (int)auVar13._12_4_;
      auVar13 = vcvtdq2pd_avx(auVar17);
      values.alloc.memoryResource = (memory_resource *)(auVar13._0_8_ * 0.99);
      testing::internal::CmpHelperGE<int,double>
                ((internal *)&distrib,"buckets[i]",".99 * expected",
                 (int *)((long)buckets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar9),(double *)&values);
      if ((char)distrib.func.alloc.memoryResource == '\0') {
        testing::Message::Message((Message *)&values);
        pcVar10 = "";
        if (distrib.func.ptr != (float *)0x0) {
          pcVar10 = *(char **)distrib.func.ptr;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x297,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&values);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&values);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&distrib.func.ptr);
      values.alloc.memoryResource = (memory_resource *)(auVar13._0_8_ * 1.01);
      testing::internal::CmpHelperLE<int,double>
                ((internal *)&distrib,"buckets[i]","1.01 * expected",
                 (int *)((long)buckets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar9),(double *)&values);
      if ((char)distrib.func.alloc.memoryResource == '\0') {
        testing::Message::Message((Message *)&values);
        pcVar10 = "";
        if (distrib.func.ptr != (float *)0x0) {
          pcVar10 = *(char **)distrib.func.ptr;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x298,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&values);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&values);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&distrib.func.ptr);
      lVar9 = lVar9 + 4;
    }
  }
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:668:16)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:668:16)>
             ::_M_manager;
  AVar7.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Sample1DFunction(&values,(function<float_(float)> *)&local_58,0x400,0x10000,0.0,1.0,AVar7);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  AVar7.memoryResource = pstd::pmr::new_delete_resource();
  f.n = values.nStored;
  f.ptr = values.ptr;
  pbrt::PiecewiseConstant1D::PiecewiseConstant1D(&distrib,f,AVar7);
  local_100._M_dataplus._M_p._0_4_ = 100;
  local_100._M_string_length = 0;
  local_100.field_2._M_allocated_capacity = 0x853c49e6748fea9b;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            (&__begin1,(IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)&local_100
            );
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            (&__end1,(IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)&local_100);
  for (; __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
         super_IndexingIterator<pbrt::detail::Uniform1DIter>.i !=
         __end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
         super_IndexingIterator<pbrt::detail::Uniform1DIter>.i;
      __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
      super_IndexingIterator<pbrt::detail::Uniform1DIter>.i =
           __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i + 1) {
    fVar16 = pbrt::RNG::Uniform<float>(&__begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng)
    ;
    fVar15 = (1.0 - fVar16) + fVar16 * 16.0;
    if (fVar15 < 0.0) {
      fVar15 = sqrtf(fVar15);
    }
    else {
      auVar13 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
      fVar15 = auVar13._0_4_;
    }
    auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)((fVar16 * 5.0) / (fVar15 + 1.0))));
    fVar15 = 0.0;
    fVar19 = auVar13._0_4_;
    if ((0.0 <= fVar19) && (fVar19 <= 1.0)) {
      fVar15 = (1.0 - fVar19) + fVar19 * 4.0;
      fVar15 = (fVar15 + fVar15) / 5.0;
    }
    local_1ac = pbrt::PiecewiseConstant1D::Sample(&distrib,fVar16,&dp,(int *)0x0);
    rng.state = 0x3f689374bc6a7efa;
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)(fVar19 - local_1ac)),auVar3);
    gtest_ar_._0_4_ = auVar13._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar_2,"std::abs(cx - dx)","3e-3",(float *)&gtest_ar_,(double *)&rng
              );
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&rng);
      std::operator<<((ostream *)(rng.state + 0x10),"Closed form = ");
      std::ostream::operator<<((void *)(rng.state + 0x10),fVar19);
      std::operator<<((ostream *)(rng.state + 0x10),", distrib = ");
      std::ostream::operator<<((void *)(rng.state + 0x10),local_1ac);
      pcVar10 = "";
      if (gtest_ar_2.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x2a5,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&rng);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&rng);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    rng.state = 0x3f689374bc6a7efa;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)(fVar15 - dp)),auVar4);
    gtest_ar_._0_4_ = auVar13._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar_2,"std::abs(cp - dp)","3e-3",(float *)&gtest_ar_,(double *)&rng
              );
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&rng);
      std::operator<<((ostream *)(rng.state + 0x10),"Closed form PDF = ");
      std::ostream::operator<<((void *)(rng.state + 0x10),fVar15);
      std::operator<<((ostream *)(rng.state + 0x10),", distrib PDF = ");
      std::ostream::operator<<((void *)(rng.state + 0x10),dp);
      pcVar10 = "";
      if (gtest_ar_2.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x2a7,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&rng);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&rng);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
  }
  __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
  super_IndexingIterator<pbrt::detail::Uniform1DIter>.i = 100;
  __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng.state = 0;
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng.inc = 0x853c49e6748fea9b;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            (&__end1,(IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)&__begin1);
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            ((Uniform1DIter *)&gtest_ar_2,
             (IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)&__begin1);
  for (; __end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
         super_IndexingIterator<pbrt::detail::Uniform1DIter>.i != gtest_ar_2._0_4_;
      __end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
      super_IndexingIterator<pbrt::detail::Uniform1DIter>.i =
           __end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i + 1) {
    local_198._0_4_ =
         pbrt::RNG::Uniform<float>(&__end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng);
    local_198._4_4_ = extraout_XMM0_Db;
    local_198._8_4_ = extraout_XMM0_Dc;
    local_198._12_4_ = extraout_XMM0_Dd;
    fVar15 = pbrt::RNG::Uniform<float>(&rng);
    fVar16 = pbrt::RNG::Uniform<float>(&rng);
    fVar15 = fVar15 * 10.0;
    fVar16 = fVar16 * 10.0;
    auVar3 = vminss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar16));
    auVar13 = vmaxss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
    a = auVar13._0_4_;
    local_1ac = auVar3._0_4_;
    FVar14 = pbrt::SampleLinear((Float)local_198._0_4_,a,local_1ac);
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(FVar14 * local_1ac)),ZEXT416((uint)(2.0 - FVar14)),
                              ZEXT416((uint)a));
    fVar16 = (FVar14 * auVar13._0_4_) / (fVar16 + fVar15);
    auVar13 = vandps_avx(local_198,auVar20);
    auVar3 = vandps_avx(ZEXT416((uint)fVar16),auVar20);
    auVar13 = vminss_avx(auVar3,auVar13);
    fVar15 = (float)local_198._0_4_ - fVar16;
    bVar5 = auVar13._0_4_ < 0.01;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    auVar13._0_4_ =
         (uint)bVar5 * (int)fVar15 +
         (uint)!bVar5 * (int)((fVar15 + fVar15) / ((float)local_198._0_4_ + fVar16));
    auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar13 = vandps_avx(auVar13,auVar20);
    gtest_ar_.success_ = auVar13._0_4_ <= 0.01;
    if (0.01 < auVar13._0_4_) {
      testing::Message::Message((Message *)&dp);
      std::operator<<((ostream *)(CONCAT44(uStack_1b4,dp) + 0x10)," u = ");
      std::ostream::operator<<((void *)(CONCAT44(uStack_1b4,dp) + 0x10),(float)local_198._0_4_);
      std::operator<<((ostream *)(CONCAT44(uStack_1b4,dp) + 0x10)," -> x ");
      std::ostream::operator<<((void *)(CONCAT44(uStack_1b4,dp) + 0x10),FVar14);
      std::operator<<((ostream *)(CONCAT44(uStack_1b4,dp) + 0x10)," -> ");
      std::ostream::operator<<((void *)(CONCAT44(uStack_1b4,dp) + 0x10),fVar16);
      std::operator<<((ostream *)(CONCAT44(uStack_1b4,dp) + 0x10)," (over ");
      std::ostream::operator<<((void *)(CONCAT44(uStack_1b4,dp) + 0x10),a);
      std::operator<<((ostream *)(CONCAT44(uStack_1b4,dp) + 0x10)," - ");
      std::ostream::operator<<((void *)(CONCAT44(uStack_1b4,dp) + 0x10),local_1ac);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_100,(internal *)&gtest_ar_,
                 (AssertionResult *)"checkErr(u, InvertLinearSample(x, low, high))","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,700,(char *)CONCAT44(local_100._M_dataplus._M_p._4_4_,
                                       local_100._M_dataplus._M_p._0_4_));
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&dp);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&dp);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(&distrib);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&values);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&buckets.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(Sampling, Linear) {
    int nBuckets = 32;
    std::vector<int> buckets(nBuckets, 0);

    int ranges[][2] = {{0, 1}, {1, 2}, {5, 50}, {100, 0}, {75, 50}};
    for (const auto r : ranges) {
        Float f0 = r[0], f1 = r[1];
        int nSamples = 1000000;
        for (int i = 0; i < nSamples; ++i) {
            Float u = (i + .5) / nSamples;
            Float t = SampleLinear(u, f0, f1);
            ++buckets[std::min<int>(t * nBuckets, nBuckets - 1)];
        }

        for (int i = 0; i < nBuckets; ++i) {
            int expected =
                Lerp(Float(i) / (nBuckets - 1), buckets[0], buckets[nBuckets - 1]);
            EXPECT_GE(buckets[i], .99 * expected);
            EXPECT_LE(buckets[i], 1.01 * expected);
        }
    }

    auto lin = [](Float v) { return 1 + 3 * v; };
    auto values = Sample1DFunction(lin, 1024, 64 * 1024, 0.f, 1.f);
    PiecewiseConstant1D distrib(values);
    for (Float u : Uniform1D(100)) {
        Float cx = SampleLinear(u, 1, 4);
        Float cp = LinearPDF(cx, 1, 4);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }

    RNG rng;
    for (Float u : Uniform1D(100)) {
        Float low = rng.Uniform<Float>() * 10;
        Float high = rng.Uniform<Float>() * 10;
        if (low < high)
            pstd::swap(low, high);
        Float x = SampleLinear(u, low, high);

        auto checkErr = [](Float a, Float b) {
            Float err;
            if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                err = std::abs(a - b);
            else
                err = std::abs(2 * (a - b) / (a + b));
            return err > 1e-2;
        };

        EXPECT_FALSE(checkErr(u, InvertLinearSample(x, low, high)))
            << " u = " << u << " -> x " << x << " -> " << InvertLinearSample(x, low, high)
            << " (over " << low << " - " << high;
    }
}